

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (0 < outw) {
    uVar2 = 0;
    do {
      fVar5 = ((float)(int)uVar2 + 0.5) * (float)w * (1.0 / (float)outw) + -0.5;
      fVar3 = floorf(fVar5);
      iVar1 = (int)fVar3;
      fVar5 = fVar5 - (float)(int)fVar3;
      fVar3 = fVar5 + 1.0;
      fVar4 = 1.0 - fVar5;
      fVar3 = (3.75 - fVar3 * 0.75) * fVar3 * fVar3 + fVar3 * -6.0 + 3.0;
      fVar5 = (fVar5 * 1.25 + -2.25) * fVar5 * fVar5 + 1.0;
      *(ulong *)alpha = CONCAT44(fVar5,fVar3);
      fVar4 = (fVar4 * 1.25 + -2.25) * fVar4 * fVar4;
      alpha[2] = fVar4 + 1.0;
      alpha[3] = -(fVar5 + fVar4 + fVar3);
      if (iVar1 < 0) {
        *alpha = 1.0 - alpha[3];
        alpha[1] = alpha[3];
        alpha[2] = 0.0;
        alpha[3] = 0.0;
        iVar1 = 1;
      }
      if (iVar1 == 0) {
        *alpha = alpha[1] + *alpha;
        *(undefined8 *)(alpha + 1) = *(undefined8 *)(alpha + 2);
        alpha[3] = 0.0;
        iVar1 = 1;
      }
      if (iVar1 == w + -2) {
        alpha[3] = alpha[3] + alpha[2];
        *(undefined8 *)(alpha + 1) = *(undefined8 *)alpha;
        *alpha = 0.0;
        iVar1 = w + -3;
      }
      if (w + -1 <= iVar1) {
        alpha[3] = 1.0 - *alpha;
        alpha[2] = *alpha;
        alpha[0] = 0.0;
        alpha[1] = 0.0;
        iVar1 = w + -3;
      }
      xofs[uVar2] = iVar1;
      uVar2 = uVar2 + 1;
      alpha = alpha + 4;
    } while ((uint)outw != uVar2);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = floor(fx);
        fx -= sx;

        interpolate_cubic(fx, alpha + dx*4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx*4 +0] = 1.f - alpha[dx*4 +3];
            alpha[dx*4 +1] = alpha[dx*4 +3];
            alpha[dx*4 +2] = 0.f;
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx*4 +0] = alpha[dx*4 +0] + alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +2];
            alpha[dx*4 +2] = alpha[dx*4 +3];
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx*4 +3] = alpha[dx*4 +2] + alpha[dx*4 +3];
            alpha[dx*4 +2] = alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +0];
            alpha[dx*4 +0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx*4 +3] = 1.f - alpha[dx*4 +0];
            alpha[dx*4 +2] = alpha[dx*4 +0];
            alpha[dx*4 +1] = 0.f;
            alpha[dx*4 +0] = 0.f;
        }

        xofs[dx] = sx;
    }
}